

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handheld-halting.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ins_e iVar1;
  ins_e iVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ostream *poVar5;
  long *plVar6;
  pointer piVar7;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar8;
  ulong in_RCX;
  int iVar9;
  long lVar10;
  pointer piVar11;
  ulong uVar12;
  bool bVar13;
  program_t copy;
  program_t program;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> local_298;
  program_t local_280;
  machine_t local_268;
  ins_e local_258 [6];
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,argc,
            argv);
  if (local_240._M_index == '\0') {
    pvVar8 = std::get<0ul,int,std::ifstream>
                       ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                        &local_240);
    iVar9 = *pvVar8;
  }
  else {
    file_00 = std::get<1ul,int,std::ifstream>
                        ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_240);
    tokenize_abi_cxx11_<std::ifstream>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298,file_00);
    handheld::read_program
              (&local_280,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_298);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
    auVar3._4_8_ = 0;
    auVar3._0_4_ = (uint)in_RCX;
    in_RCX = in_RCX & 0xffffffff;
    local_298.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
    super__Vector_impl_data._0_12_ =
         handheld::execute((handheld *)&local_280,(program_t *)0x0,(machine_t)(auVar3 << 0x40));
    operator<<((ostream *)&std::cout,(machine_t *)&local_298);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    local_258[0] = jmp;
    local_258[1] = nop;
    local_258[2] = nop;
    local_258[3] = jmp;
    lVar10 = 0;
    piVar7 = local_280.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    piVar11 = local_280.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar13 = piVar7 != piVar11;
      piVar7 = piVar11;
      if (bVar13) {
        uVar12 = 0;
        do {
          std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::vector
                    (&local_298,&local_280);
          iVar1 = local_298.
                  super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12].ins;
          if (iVar1 == *(ins_e *)((long)local_258 + lVar10)) {
            iVar2 = *(ins_e *)((long)local_258 + lVar10 + 4);
            local_298.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar12].ins = iVar2;
            auVar4._4_8_ = 0;
            auVar4._0_4_ = (uint)in_RCX;
            local_268 = handheld::execute((handheld *)&local_298,(program_t *)0x0,
                                          (machine_t)(auVar4 << 0x40));
            if (local_268.exit == normal) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Part 2: Changed instruction ",0x1c);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              plVar6 = (long *)(handheld::ins_strs + 0x10);
              do {
                plVar6 = (long *)*plVar6;
              } while (*(ins_e *)(plVar6 + 3) != iVar1);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(char *)plVar6[2],plVar6[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," to ",4);
              plVar6 = (long *)(handheld::ins_strs + 0x10);
              do {
                plVar6 = (long *)*plVar6;
              } while (*(ins_e *)(plVar6 + 3) != iVar2);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(char *)plVar6[2],plVar6[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; ",2);
              operator<<(poVar5,&local_268);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            }
            if (local_298.super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00102c08;
          }
          else {
LAB_00102c08:
            operator_delete(local_298.
                            super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_298.
                                  super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_298.
                                  super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar12 = uVar12 + 1;
          in_RCX = (long)local_280.
                         super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_280.
                         super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          piVar7 = local_280.
                   super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          piVar11 = local_280.
                    super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < in_RCX);
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x10);
    if (piVar11 != (pointer)0x0) {
      operator_delete(piVar11,(long)local_280.
                                    super__Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)piVar11);
    }
    iVar9 = 0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
  ~_Variant_storage(&local_240);
  return iVar9;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  using namespace handheld;
  
  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto program = read_program(tokenize(input));

  std::cout << "Part 1: " << execute(program) << "\n";

  using from_to_t = std::pair<ins_e, ins_e>;
  for (const auto& [from, to] : { from_to_t{ins_e::jmp, ins_e::nop}, {ins_e::nop, ins_e::jmp} }) {
    for (size_t i = 0; i < program.size(); i++) {
      auto copy = program;
      if (copy[i].ins == from) {
        copy[i].ins = to;
        auto machine = execute(copy);
        if (machine.exit == machine_t::exit_e::normal)
          std::cout << "Part 2: Changed instruction " << i << " " << ins_str(from) << " to " << ins_str(to) << "; " << machine << "\n";
      }
    }
  }
}